

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

unique_ptr<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>,_true> __thiscall
duckdb::LikeMatcher::CreateLikeMatcher(LikeMatcher *this,string *like_pattern,char escape)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  _func_int *p_Var4;
  pointer pLVar5;
  pointer pLVar6;
  pointer pLVar7;
  _func_int **pp_Var8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  vector<duckdb::LikeSegment,_true> segments;
  undefined1 local_a0;
  undefined1 local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_> local_68;
  vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_> local_48;
  
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar12 = like_pattern->_M_string_length == 0;
  bVar11 = !bVar12;
  if (bVar12) {
    local_90 = 0;
    local_a0 = 0;
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    uVar10 = 0;
    local_a0 = 0;
    local_90 = 0;
    do {
      cVar3 = (like_pattern->_M_dataplus)._M_p[uVar10];
      if (((cVar3 == escape) || (cVar3 == '_')) || (bVar12 = true, cVar3 == '%')) {
        if (uVar9 < uVar10) {
          ::std::__cxx11::string::substr((ulong)&local_88,(ulong)like_pattern);
          ::std::vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>>::
          emplace_back<std::__cxx11::string>
                    ((vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>> *)&local_68,
                     &local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        uVar9 = uVar10 + 1;
        if (cVar3 == escape || cVar3 == '_') {
          (this->super_FunctionData)._vptr_FunctionData = (_func_int **)0x0;
          bVar12 = false;
        }
        else {
          if (uVar10 == 0) {
            local_90 = 1;
          }
          if (uVar9 == like_pattern->_M_string_length) {
            local_a0 = 1;
          }
          bVar12 = true;
        }
      }
      if (!bVar12) break;
      uVar10 = uVar10 + 1;
      bVar11 = uVar10 < like_pattern->_M_string_length;
    } while (bVar11);
  }
  if (!bVar11) {
    if (uVar9 < like_pattern->_M_string_length) {
      ::std::__cxx11::string::substr((ulong)&local_88,(ulong)like_pattern);
      ::std::vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>>::
      emplace_back<std::__cxx11::string>
                ((vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>> *)&local_68,
                 &local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    pLVar6 = local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pLVar5 = local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      (this->super_FunctionData)._vptr_FunctionData = (_func_int **)0x0;
    }
    else {
      pp_Var8 = (_func_int **)operator_new(0x48);
      pLVar7 = local_68.
               super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
      paVar2 = &local_88.field_2;
      local_88._M_dataplus._M_p = (like_pattern->_M_dataplus)._M_p;
      paVar1 = &like_pattern->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == paVar1) {
        local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_88.field_2._8_8_ = *(undefined8 *)((long)&like_pattern->field_2 + 8);
        local_88._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      p_Var4 = (_func_int *)like_pattern->_M_string_length;
      (like_pattern->_M_dataplus)._M_p = (pointer)paVar1;
      like_pattern->_M_string_length = 0;
      (like_pattern->field_2)._M_local_buf[0] = '\0';
      local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *pp_Var8 = (_func_int *)&PTR__LikeMatcher_0247fca8;
      pp_Var8[1] = (_func_int *)(pp_Var8 + 3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == paVar2) {
        pp_Var8[3] = (_func_int *)local_88.field_2._M_allocated_capacity;
        pp_Var8[4] = (_func_int *)local_88.field_2._8_8_;
      }
      else {
        pp_Var8[1] = (_func_int *)local_88._M_dataplus._M_p;
        pp_Var8[3] = (_func_int *)local_88.field_2._M_allocated_capacity;
      }
      pp_Var8[2] = p_Var4;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity =
           local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
      pp_Var8[5] = (_func_int *)pLVar5;
      pp_Var8[6] = (_func_int *)pLVar6;
      pp_Var8[7] = (_func_int *)pLVar7;
      local_48.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 *)(pp_Var8 + 8) = local_90;
      *(undefined1 *)((long)pp_Var8 + 0x41) = local_a0;
      (this->super_FunctionData)._vptr_FunctionData = pp_Var8;
      local_88._M_dataplus._M_p = (pointer)paVar2;
      ::std::vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>::~vector(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
  }
  ::std::vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>::~vector(&local_68);
  return (unique_ptr<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>_>)
         (unique_ptr<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>_>)this;
}

Assistant:

static unique_ptr<LikeMatcher> CreateLikeMatcher(string like_pattern, char escape = '\0') {
		vector<LikeSegment> segments;
		idx_t last_non_pattern = 0;
		bool has_start_percentage = false;
		bool has_end_percentage = false;
		for (idx_t i = 0; i < like_pattern.size(); i++) {
			auto ch = like_pattern[i];
			if (ch == escape || ch == '%' || ch == '_') {
				// special character, push a constant pattern
				if (i > last_non_pattern) {
					segments.emplace_back(like_pattern.substr(last_non_pattern, i - last_non_pattern));
				}
				last_non_pattern = i + 1;
				if (ch == escape || ch == '_') {
					// escape or underscore: could not create efficient like matcher
					// FIXME: we could handle escaped percentages here
					return nullptr;
				} else {
					// sample_size
					if (i == 0) {
						has_start_percentage = true;
					}
					if (i + 1 == like_pattern.size()) {
						has_end_percentage = true;
					}
				}
			}
		}
		if (last_non_pattern < like_pattern.size()) {
			segments.emplace_back(like_pattern.substr(last_non_pattern, like_pattern.size() - last_non_pattern));
		}
		if (segments.empty()) {
			return nullptr;
		}
		return make_uniq<LikeMatcher>(std::move(like_pattern), std::move(segments), has_start_percentage,
		                              has_end_percentage);
	}